

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O1

void Dsd_CheckCacheAllocate(int nEntries)

{
  uint uVar1;
  Dds_Cache_t *pDVar2;
  Dsd_Entry_t *pDVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  pDVar2 = (Dds_Cache_t *)malloc(0x18);
  pCache = pDVar2;
  pDVar2->pTable = (Dsd_Entry_t *)0x0;
  pDVar2->nTableSize = 0;
  pDVar2->nSuccess = 0;
  *(undefined8 *)&pDVar2->nFailure = 0;
  uVar4 = nEntries - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar1 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar1 != 0);
    if (uVar5 < 9) break;
    iVar6 = 5;
    while (uVar5 % (iVar6 - 2U) != 0) {
      uVar1 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar5 < uVar1) goto LAB_007b66a2;
    }
  }
LAB_007b66a2:
  if (pDVar2->nTableSize != uVar5) {
    if (pDVar2->nTableSize != 0) {
      Dsd_CheckCacheDeallocate();
    }
    pDVar2 = pCache;
    pCache->nTableSize = uVar5;
    pDVar3 = (Dsd_Entry_t *)malloc((long)(int)uVar5 * 0x28);
    pDVar2->pTable = pDVar3;
  }
  pDVar2 = pCache;
  iVar6 = pCache->nTableSize;
  if (0 < iVar6) {
    do {
      pDVar2->pTable->bX[0] = (DdNode *)0x0;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void Dsd_CheckCacheAllocate( int nEntries )
{
    int nRequested;

    pCache = ABC_ALLOC( Dds_Cache_t, 1 );
    memset( pCache, 0, sizeof(Dds_Cache_t) );

    // check what is the size of the current cache
    nRequested = Abc_PrimeCudd( nEntries );
    if ( pCache->nTableSize != nRequested )
    { // the current size is different
        // deallocate the old, allocate the new
        if ( pCache->nTableSize )
            Dsd_CheckCacheDeallocate();
        // allocate memory for the hash table
        pCache->nTableSize = nRequested;
        pCache->pTable = ABC_ALLOC( Dsd_Entry_t, nRequested );
    }
    // otherwise, there is no need to allocate, just clean
    Dsd_CheckCacheClear();
//  printf( "\nThe number of allocated cache entries = %d.\n\n", pCache->nTableSize );
}